

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O0

aiExportDataBlob * __thiscall Assimp::BlobIOStream::GetBlob(BlobIOStream *this)

{
  aiExportDataBlob *this_00;
  aiExportDataBlob *blob;
  BlobIOStream *this_local;
  
  this_00 = (aiExportDataBlob *)operator_new(0x420);
  aiExportDataBlob::aiExportDataBlob(this_00);
  this_00->size = this->file_size;
  this_00->data = this->buffer;
  this->buffer = (uint8_t *)0x0;
  return this_00;
}

Assistant:

aiExportDataBlob* GetBlob()
    {
        aiExportDataBlob* blob = new aiExportDataBlob();
        blob->size = file_size;
        blob->data = buffer;

        buffer = NULL;

        return blob;
    }